

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::GetAllTestDependencies
          (cmCTestMultiProcessHandler *this,int test,TestList *dependencies)

{
  iterator __position;
  mapped_type *pmVar1;
  _Rb_tree_node_base *p_Var2;
  int local_2c;
  
  local_2c = test;
  pmVar1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::operator[](&(this->Tests).
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                        ,&local_2c);
  for (p_Var2 = (pmVar1->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(pmVar1->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
       super__Rb_tree_header; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    GetAllTestDependencies(this,p_Var2[1]._M_color,dependencies);
    __position._M_current =
         (dependencies->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (dependencies->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)dependencies,__position,(int *)(p_Var2 + 1));
    }
    else {
      *__position._M_current = p_Var2[1]._M_color;
      (dependencies->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::GetAllTestDependencies(
    int test, TestList& dependencies)
{
  TestSet const& dependencySet = this->Tests[test];
  for(TestSet::const_iterator i = dependencySet.begin();
    i != dependencySet.end(); ++i)
    {
    GetAllTestDependencies(*i, dependencies);
    dependencies.push_back(*i);
    }
}